

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packed_func.h
# Opt level: O3

void __thiscall
tvm::runtime::TVMRetValue::SwitchToClass<tvm::runtime::PackedFunc>
          (TVMRetValue *this,int type_code,PackedFunc *v)

{
  function<void_(tvm::runtime::TVMArgs,_tvm::runtime::TVMRetValue_*)> *this_00;
  
  if ((this->super_TVMPODValue_).type_code_ == type_code) {
    std::function<void_(tvm::runtime::TVMArgs,_tvm::runtime::TVMRetValue_*)>::operator=
              ((function<void_(tvm::runtime::TVMArgs,_tvm::runtime::TVMRetValue_*)> *)
               (this->super_TVMPODValue_).value_.v_handle,&v->body_);
    return;
  }
  Clear(this);
  (this->super_TVMPODValue_).type_code_ = type_code;
  this_00 = (function<void_(tvm::runtime::TVMArgs,_tvm::runtime::TVMRetValue_*)> *)
            operator_new(0x20);
  std::function<void_(tvm::runtime::TVMArgs,_tvm::runtime::TVMRetValue_*)>::function
            (this_00,&v->body_);
  (this->super_TVMPODValue_).value_.v_handle = this_00;
  return;
}

Assistant:

void SwitchToClass(int type_code, T v) {
    if (type_code_ != type_code) {
      this->Clear();
      type_code_ = type_code;
      value_.v_handle = new T(v);
    } else {
      *static_cast<T *>(value_.v_handle) = v;
    }
  }